

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::BuildUniqueBoneList
               (list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *asBones,
               const_iterator it,const_iterator end)

{
  size_t *psVar1;
  aiBone *paVar2;
  iterator iVar3;
  ai_uint32 aVar4;
  _List_node_base *p_Var6;
  aiMesh *paVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  char *__s;
  pair<aiBone_*,_unsigned_int> local_48;
  aiMesh **local_38;
  size_t sVar5;
  
  if (it._M_current != end._M_current) {
    uVar8 = 0;
    local_38 = end._M_current;
    do {
      paVar7 = *it._M_current;
      if (paVar7->mNumBones != 0) {
        uVar11 = 0;
        do {
          paVar2 = paVar7->mBones[uVar11];
          __s = (paVar2->mName).data;
          aVar4 = (paVar2->mName).length;
          if (aVar4 == 0) {
            sVar5 = strlen(__s);
            aVar4 = (ai_uint32)sVar5;
          }
          uVar10 = 0;
          if (3 < aVar4) {
            uVar9 = aVar4 >> 2;
            uVar10 = 0;
            do {
              uVar10 = (*(ushort *)__s + uVar10) * 0x10000 ^
                       (uint)*(ushort *)(__s + 2) << 0xb ^ *(ushort *)__s + uVar10;
              __s = __s + 4;
              uVar10 = (uVar10 >> 0xb) + uVar10;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          switch(aVar4 & 3) {
          case 1:
            uVar9 = (uVar10 + (int)*__s) * 0x400 ^ uVar10 + (int)*__s;
            uVar10 = uVar9 >> 1;
            goto LAB_003c11d1;
          case 2:
            uVar9 = (uVar10 + *(ushort *)__s) * 0x800 ^ uVar10 + *(ushort *)__s;
            uVar10 = uVar9 >> 0x11;
LAB_003c11d1:
            uVar10 = uVar10 + uVar9;
            break;
          case 3:
            uVar10 = (uVar10 + *(ushort *)__s) * 0x10000 ^
                     (int)__s[2] << 0x12 ^ uVar10 + *(ushort *)__s;
            uVar10 = (uVar10 >> 0xb) + uVar10;
          }
          uVar10 = uVar10 * 8 ^ uVar10;
          uVar10 = (uVar10 >> 5) + uVar10;
          uVar10 = uVar10 * 0x10 ^ uVar10;
          uVar10 = (uVar10 >> 0x11) + uVar10;
          uVar10 = uVar10 * 0x2000000 ^ uVar10;
          iVar12 = (uVar10 >> 6) + uVar10;
          p_Var6 = (_List_node_base *)asBones;
          do {
            p_Var6 = (((_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                      &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var6 == (_List_node_base *)asBones) goto LAB_003c126e;
          } while (*(int *)&p_Var6[1]._M_next != iVar12);
          iVar3._M_current = (pair<aiBone_*,_unsigned_int> *)p_Var6[2]._M_prev;
          if ((_List_node_base *)iVar3._M_current == p_Var6[3]._M_next) {
            local_48.first = paVar2;
            local_48.second = uVar8;
            std::
            vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
            ::_M_realloc_insert<std::pair<aiBone*,unsigned_int>>
                      ((vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
                        *)(p_Var6 + 2),iVar3,&local_48);
          }
          else {
            (iVar3._M_current)->first = paVar2;
            *(ulong *)&(iVar3._M_current)->second = CONCAT44(local_48._12_4_,uVar8);
            p_Var6[2]._M_prev = p_Var6[2]._M_prev + 1;
            local_48.first = paVar2;
            local_48.second = uVar8;
          }
          if (p_Var6 == (_List_node_base *)asBones) {
LAB_003c126e:
            p_Var6 = (_List_node_base *)operator_new(0x38);
            p_Var6[1]._M_next = (_List_node_base *)0x0;
            p_Var6[1]._M_prev = (_List_node_base *)0x0;
            p_Var6[2]._M_next = (_List_node_base *)0x0;
            p_Var6[2]._M_prev = (_List_node_base *)0x0;
            p_Var6[3]._M_next = (_List_node_base *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar1 = &(asBones->
                      super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>)
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var6 = (asBones->
                     super__List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            *(int *)&p_Var6[1]._M_next = iVar12;
            p_Var6[1]._M_prev = (_List_node_base *)paVar2;
            iVar3._M_current = (pair<aiBone_*,_unsigned_int> *)p_Var6[2]._M_prev;
            if ((_List_node_base *)iVar3._M_current == p_Var6[3]._M_next) {
              local_48.first = paVar2;
              local_48.second = uVar8;
              std::
              vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
              ::_M_realloc_insert<std::pair<aiBone*,unsigned_int>>
                        ((vector<std::pair<aiBone*,unsigned_int>,std::allocator<std::pair<aiBone*,unsigned_int>>>
                          *)(p_Var6 + 2),iVar3,&local_48);
            }
            else {
              (iVar3._M_current)->first = paVar2;
              *(ulong *)&(iVar3._M_current)->second = CONCAT44(local_48._12_4_,uVar8);
              p_Var6[2]._M_prev = p_Var6[2]._M_prev + 1;
              local_48.first = paVar2;
              local_48.second = uVar8;
            }
          }
          uVar11 = uVar11 + 1;
          paVar7 = *it._M_current;
        } while (uVar11 < paVar7->mNumBones);
      }
      uVar8 = uVar8 + paVar7->mNumVertices;
      it._M_current = it._M_current + 1;
    } while (it._M_current != local_38);
  }
  return;
}

Assistant:

void SceneCombiner::BuildUniqueBoneList(std::list<BoneWithHash>& asBones,
    std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    unsigned int iOffset = 0;
    for (; it != end;++it)  {
        for (unsigned int l = 0; l < (*it)->mNumBones;++l)  {
            aiBone* p = (*it)->mBones[l];
            uint32_t itml = SuperFastHash(p->mName.data,(unsigned int)p->mName.length);

            std::list<BoneWithHash>::iterator it2  = asBones.begin();
            std::list<BoneWithHash>::iterator end2 = asBones.end();

            for (;it2 != end2;++it2)    {
                if ((*it2).first == itml)   {
                    (*it2).pSrcBones.push_back(BoneSrcIndex(p,iOffset));
                    break;
                }
            }
            if (end2 == it2)    {
                // need to begin a new bone entry
                asBones.push_back(BoneWithHash());
                BoneWithHash& btz = asBones.back();

                // setup members
                btz.first = itml;
                btz.second = &p->mName;
                btz.pSrcBones.push_back(BoneSrcIndex(p,iOffset));
            }
        }
        iOffset += (*it)->mNumVertices;
    }
}